

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O0

void __thiscall TypeOpIntRem::TypeOpIntRem(TypeOpIntRem *this,TypeFactory *t)

{
  OpBehavior *this_00;
  allocator local_39;
  string local_38 [32];
  TypeFactory *local_18;
  TypeFactory *t_local;
  TypeOpIntRem *this_local;
  
  local_18 = t;
  t_local = (TypeFactory *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"%",&local_39);
  TypeOpBinary::TypeOpBinary
            (&this->super_TypeOpBinary,t,CPUI_INT_REM,(string *)local_38,TYPE_UINT,TYPE_UINT);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  (this->super_TypeOpBinary).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_0084bb18;
  (this->super_TypeOpBinary).super_TypeOp.opflags = 0x10000;
  (this->super_TypeOpBinary).super_TypeOp.addlflags = 3;
  this_00 = (OpBehavior *)operator_new(0x10);
  OpBehaviorIntRem::OpBehaviorIntRem((OpBehaviorIntRem *)this_00);
  (this->super_TypeOpBinary).super_TypeOp.behave = this_00;
  return;
}

Assistant:

TypeOpIntRem::TypeOpIntRem(TypeFactory *t)
  : TypeOpBinary(t,CPUI_INT_REM,"%",TYPE_UINT,TYPE_UINT)
{
  opflags = PcodeOp::binary;
  addlflags = inherits_sign | inherits_sign_zero;
  behave = new OpBehaviorIntRem();
}